

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::ChainPromiseNode::~ChainPromiseNode(ChainPromiseNode *this)

{
  PromiseArenaMember *node;
  long in_FS_OFFSET;
  
  node = &((this->inner).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->inner).ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  Event::~Event(&this->super_Event);
  if (*(long *)(in_FS_OFFSET + -0x30) == 0) {
    return;
  }
  AsyncObject::failed();
}

Assistant:

ChainPromiseNode::~ChainPromiseNode() noexcept(false) {}